

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypt_and_hash.c
# Opt level: O2

int main(int argc,char **argv)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  FILE *__stream;
  FILE *__s;
  mbedtls_cipher_info_t *pmVar4;
  mbedtls_md_info_t *pmVar5;
  FILE *pFVar6;
  size_t sVar7;
  mbedtls_cipher_type_t *pmVar8;
  mbedtls_md_type_t *pmVar9;
  ulong uVar10;
  uchar *puVar11;
  size_t sVar12;
  size_t __n;
  uint uVar13;
  long lVar14;
  long lVar15;
  char *__format;
  char *pcVar16;
  ulong uVar17;
  int *piVar18;
  bool bVar19;
  size_t sStack_b70;
  int local_b5c;
  size_t olen;
  ulong local_b30;
  mbedtls_md_info_t *local_b28;
  uint local_b1c;
  mbedtls_md_context_t md_ctx;
  int n;
  uchar IV [16];
  mbedtls_cipher_context_t cipher_ctx;
  byte local_a78 [8];
  uchar auStack_a70 [8];
  undefined8 local_a68;
  undefined8 uStack_a60;
  uchar key [512];
  uchar buffer [1024];
  uchar output [1024];
  
  mbedtls_cipher_init(&cipher_ctx);
  mbedtls_md_init(&md_ctx);
  if (argc != 7) {
    puts(
        "\n  crypt_and_hash <mode> <input filename> <output filename> <cipher> <mbedtls_md> <key>\n\n   <mode>: 0 = encrypt, 1 = decrypt\n\n  example: crypt_and_hash 0 file file.aes AES-128-CBC SHA1 hex:E76B2413958B00E193\n"
        );
    puts("Available ciphers:");
    for (pmVar8 = (mbedtls_cipher_type_t *)mbedtls_cipher_list(); *pmVar8 != MBEDTLS_CIPHER_NONE;
        pmVar8 = pmVar8 + 1) {
      pmVar4 = mbedtls_cipher_info_from_type(*pmVar8);
      printf("  %s\n",pmVar4->name);
    }
    puts("\nAvailable message digests:");
    pmVar9 = (mbedtls_md_type_t *)mbedtls_md_list();
    local_b5c = 1;
    for (; *pmVar9 != MBEDTLS_MD_NONE; pmVar9 = pmVar9 + 1) {
      pmVar5 = mbedtls_md_info_from_type(*pmVar9);
      pcVar16 = mbedtls_md_get_name(pmVar5);
      printf("  %s\n",pcVar16);
    }
    goto LAB_0010703d;
  }
  local_b1c = atoi(argv[1]);
  if (local_b1c < 2) {
    pcVar16 = argv[2];
    iVar3 = strcmp(pcVar16,argv[3]);
    if (iVar3 == 0) {
      pcVar16 = "input and output filenames must differ\n";
      sStack_b70 = 0x27;
      goto LAB_00106c44;
    }
    __stream = fopen(pcVar16,"rb");
    if (__stream != (FILE *)0x0) {
      __s = fopen(argv[3],"wb+");
      if (__s == (FILE *)0x0) {
        pcVar16 = argv[3];
        __format = "fopen(%s,wb+) failed\n";
LAB_00106cd5:
        fprintf(_stderr,__format,pcVar16);
LAB_00106cdc:
        local_b5c = 1;
      }
      else {
        pmVar4 = mbedtls_cipher_info_from_string(argv[4]);
        if (pmVar4 == (mbedtls_cipher_info_t *)0x0) {
          pcVar16 = argv[4];
          __format = "Cipher \'%s\' not found\n";
          goto LAB_00106cd5;
        }
        iVar3 = mbedtls_cipher_setup(&cipher_ctx,pmVar4);
        if (iVar3 != 0) {
          fwrite("mbedtls_cipher_setup failed\n",0x1c,1,_stderr);
          goto LAB_00106cdc;
        }
        pmVar5 = mbedtls_md_info_from_string(argv[5]);
        if (pmVar5 == (mbedtls_md_info_t *)0x0) {
          pcVar16 = argv[5];
          __format = "Message Digest \'%s\' not found\n";
          goto LAB_00106cd5;
        }
        local_b5c = 1;
        iVar3 = mbedtls_md_setup(&md_ctx,pmVar5,1);
        if (iVar3 == 0) {
          pFVar6 = fopen(argv[6],"rb");
          local_b28 = pmVar5;
          if (pFVar6 == (FILE *)0x0) {
            piVar18 = (int *)argv[6];
            if (*piVar18 == 0x3a786568) {
              piVar18 = piVar18 + 1;
              for (sVar7 = 0;
                  (iVar3 = __isoc99_sscanf(piVar18,"%02X",&n), pmVar5 = local_b28, 0 < iVar3 &&
                  (sVar7 < 0x200)); sVar7 = sVar7 + 1) {
                key[sVar7] = (uchar)n;
                piVar18 = (int *)((long)piVar18 + 2);
              }
            }
            else {
              sVar12 = strlen((char *)piVar18);
              sVar7 = 0x200;
              if (sVar12 < 0x200) {
                sVar7 = sVar12;
              }
              memcpy(key,piVar18,sVar7);
              pmVar5 = local_b28;
            }
          }
          else {
            sVar7 = fread(key,1,0x200,pFVar6);
            fclose(pFVar6);
          }
          iVar3 = fileno(__stream);
          uVar10 = lseek(iVar3,0,2);
          if ((long)uVar10 < 0) {
            perror("lseek");
          }
          else {
            iVar3 = fseek(__stream,0,0);
            if (iVar3 < 0) {
              pcVar16 = "fseek(0,SEEK_SET) failed\n";
              sStack_b70 = 0x19;
            }
            else {
              local_b30 = uVar10;
              if ((local_b1c & 1) == 0) {
                puVar11 = buffer;
                for (lVar14 = 0; lVar14 != 0x40; lVar14 = lVar14 + 8) {
                  *puVar11 = (uchar)(uVar10 >> ((byte)lVar14 & 0x3f));
                  puVar11 = puVar11 + 1;
                }
                puVar11 = (uchar *)argv[2];
                mbedtls_md_starts(&md_ctx);
                mbedtls_md_update(&md_ctx,buffer,8);
                sVar12 = strlen((char *)puVar11);
                mbedtls_md_update(&md_ctx,puVar11,sVar12);
                mbedtls_md_finish(&md_ctx,local_a78);
                IV[0] = local_a78[0];
                IV[1] = local_a78[1];
                IV[2] = local_a78[2];
                IV[3] = local_a78[3];
                IV[4] = local_a78[4];
                IV[5] = local_a78[5];
                IV[6] = local_a78[6];
                IV[7] = local_a78[7];
                IV[8] = auStack_a70[0];
                IV[9] = auStack_a70[1];
                IV[10] = auStack_a70[2];
                IV[0xb] = auStack_a70[3];
                IV[0xc] = auStack_a70[4];
                IV[0xd] = auStack_a70[5];
                IV[0xe] = auStack_a70[6];
                IV[0xf] = auStack_a70[7];
                sVar12 = fwrite(IV,1,0x10,__s);
                if (sVar12 == 0x10) {
                  local_a68 = 0;
                  uStack_a60 = 0;
                  local_a78[0] = IV[0];
                  local_a78[1] = IV[1];
                  local_a78[2] = IV[2];
                  local_a78[3] = IV[3];
                  local_a78[4] = IV[4];
                  local_a78[5] = IV[5];
                  local_a78[6] = IV[6];
                  local_a78[7] = IV[7];
                  auStack_a70[0] = IV[8];
                  auStack_a70[1] = IV[9];
                  auStack_a70[2] = IV[10];
                  auStack_a70[3] = IV[0xb];
                  auStack_a70[4] = IV[0xc];
                  auStack_a70[5] = IV[0xd];
                  auStack_a70[6] = IV[0xe];
                  auStack_a70[7] = IV[0xf];
                  iVar3 = 0x2000;
                  while (bVar19 = iVar3 != 0, iVar3 = iVar3 + -1, bVar19) {
                    mbedtls_md_starts(&md_ctx);
                    mbedtls_md_update(&md_ctx,local_a78,0x20);
                    mbedtls_md_update(&md_ctx,key,sVar7);
                    mbedtls_md_finish(&md_ctx,local_a78);
                  }
                  iVar3 = mbedtls_cipher_setkey
                                    (&cipher_ctx,local_a78,pmVar4->key_bitlen,MBEDTLS_ENCRYPT);
                  if (iVar3 == 0) {
                    iVar3 = mbedtls_cipher_set_iv(&cipher_ctx,IV,0x10);
                    if (iVar3 == 0) {
                      iVar3 = mbedtls_cipher_reset(&cipher_ctx);
                      if (iVar3 == 0) {
                        mbedtls_md_hmac_starts(&md_ctx,local_a78,0x20);
                        uVar10 = local_b30 & 0xffffffff;
                        for (lVar14 = 0; lVar14 < (long)local_b30; lVar14 = lVar14 + uVar17) {
                          lVar15 = uVar10 - lVar14;
                          if (cipher_ctx.cipher_info == (mbedtls_cipher_info_t *)0x0) {
                            __n = 0;
                            if (lVar15 < 1) goto LAB_001066d1;
                          }
                          else {
                            __n = (size_t)(cipher_ctx.cipher_info)->block_size;
                            if (lVar15 <= (long)__n) {
LAB_001066d1:
                              __n = (size_t)(uint)((int)local_b30 - (int)lVar14);
                            }
                          }
                          sVar12 = fread(buffer,1,__n,__stream);
                          if (sVar12 != __n) {
                            pcVar16 = "fread(%ld bytes) failed\n";
LAB_00106ef8:
                            fprintf(_stderr,pcVar16,__n);
                            goto LAB_00106f63;
                          }
                          iVar3 = mbedtls_cipher_update(&cipher_ctx,buffer,__n,output,&olen);
                          if (iVar3 != 0) {
                            pcVar16 = "mbedtls_cipher_update() returned error\n";
                            goto LAB_00106f42;
                          }
                          mbedtls_md_hmac_update(&md_ctx,output,olen);
                          sVar12 = fwrite(output,1,olen,__s);
                          if (sVar12 != olen) {
                            pcVar16 = "fwrite(%ld bytes) failed\n";
                            __n = olen;
                            goto LAB_00106ef8;
                          }
                          if (cipher_ctx.cipher_info == (mbedtls_cipher_info_t *)0x0) {
                            uVar17 = 0;
                          }
                          else {
                            uVar17 = (ulong)(cipher_ctx.cipher_info)->block_size;
                          }
                        }
                        iVar3 = mbedtls_cipher_finish(&cipher_ctx,output,&olen);
                        if (iVar3 == 0) {
                          mbedtls_md_hmac_update(&md_ctx,output,olen);
                          sVar12 = fwrite(output,1,olen,__s);
                          if (sVar12 == olen) {
                            mbedtls_md_hmac_finish(&md_ctx,local_a78);
                            pmVar5 = local_b28;
                            bVar1 = mbedtls_md_get_size(local_b28);
                            sVar12 = fwrite(local_a78,1,(ulong)bVar1,__s);
                            bVar1 = mbedtls_md_get_size(pmVar5);
                            pFVar6 = _stderr;
                            if (sVar12 == bVar1) {
                              if (local_b1c == 1) goto LAB_0010684c;
                              local_b5c = 0;
                            }
                            else {
                              bVar1 = mbedtls_md_get_size(pmVar5);
                              fprintf(pFVar6,"fwrite(%d bytes) failed\n",(ulong)bVar1);
                              local_b5c = 1;
                            }
                          }
                          else {
                            fprintf(_stderr,"fwrite(%ld bytes) failed\n");
                            local_b5c = 1;
                          }
                          goto LAB_00107023;
                        }
                        pcVar16 = "mbedtls_cipher_finish() returned error\n";
LAB_00106f42:
                        fwrite(pcVar16,0x27,1,_stderr);
LAB_00106f63:
                        local_b5c = 1;
                        goto LAB_00107023;
                      }
                      pcVar16 = "mbedtls_cipher_reset() returned error\n";
                      sStack_b70 = 0x26;
                    }
                    else {
                      pcVar16 = "mbedtls_cipher_set_iv() returned error\n";
                      sStack_b70 = 0x27;
                    }
                    fwrite(pcVar16,sStack_b70,1,_stderr);
                    local_b5c = 1;
                  }
                  else {
                    fwrite("mbedtls_cipher_setkey() returned error\n",0x27,1,_stderr);
LAB_00106dc6:
                    local_b5c = 1;
                  }
                }
                else {
                  pcVar16 = "fwrite(%d bytes) failed\n";
LAB_00106d80:
                  uVar10 = 0x10;
LAB_00107012:
                  fprintf(_stderr,pcVar16,uVar10);
                }
                goto LAB_00107023;
              }
LAB_0010684c:
              uVar10 = local_b30;
              bVar1 = mbedtls_md_get_size(pmVar5);
              if ((long)uVar10 < (long)((ulong)bVar1 + 0x10)) {
                pcVar16 = "File too short to be encrypted.\n";
                sStack_b70 = 0x20;
              }
              else {
                if ((cipher_ctx.cipher_info != (mbedtls_cipher_info_t *)0x0) &&
                   ((cipher_ctx.cipher_info)->block_size != 0)) {
                  if (pmVar4->mode == MBEDTLS_MODE_GCM) {
LAB_001068bd:
                    bVar1 = mbedtls_md_get_size(pmVar5);
                    sVar12 = fread(buffer,1,0x10,__stream);
                    if (sVar12 == 0x10) {
                      local_b30 = (local_b30 - bVar1) - 0x10;
                      IV[0] = buffer[0];
                      IV[1] = buffer[1];
                      IV[2] = buffer[2];
                      IV[3] = buffer[3];
                      IV[4] = buffer[4];
                      IV[5] = buffer[5];
                      IV[6] = buffer[6];
                      IV[7] = buffer[7];
                      IV[8] = buffer[8];
                      IV[9] = buffer[9];
                      IV[10] = buffer[10];
                      IV[0xb] = buffer[0xb];
                      IV[0xc] = buffer[0xc];
                      IV[0xd] = buffer[0xd];
                      IV[0xe] = buffer[0xe];
                      IV[0xf] = buffer[0xf];
                      local_a68 = 0;
                      uStack_a60 = 0;
                      local_a78[0] = buffer[0];
                      local_a78[1] = buffer[1];
                      local_a78[2] = buffer[2];
                      local_a78[3] = buffer[3];
                      local_a78[4] = buffer[4];
                      local_a78[5] = buffer[5];
                      local_a78[6] = buffer[6];
                      local_a78[7] = buffer[7];
                      auStack_a70[0] = buffer[8];
                      auStack_a70[1] = buffer[9];
                      auStack_a70[2] = buffer[10];
                      auStack_a70[3] = buffer[0xb];
                      auStack_a70[4] = buffer[0xc];
                      auStack_a70[5] = buffer[0xd];
                      auStack_a70[6] = buffer[0xe];
                      auStack_a70[7] = buffer[0xf];
                      iVar3 = 0x2000;
                      while (bVar19 = iVar3 != 0, iVar3 = iVar3 + -1, bVar19) {
                        mbedtls_md_starts(&md_ctx);
                        mbedtls_md_update(&md_ctx,local_a78,0x20);
                        mbedtls_md_update(&md_ctx,key,sVar7);
                        mbedtls_md_finish(&md_ctx,local_a78);
                      }
                      iVar3 = mbedtls_cipher_setkey
                                        (&cipher_ctx,local_a78,pmVar4->key_bitlen,MBEDTLS_DECRYPT);
                      if (iVar3 == 0) {
                        iVar3 = mbedtls_cipher_set_iv(&cipher_ctx,IV,0x10);
                        if (iVar3 == 0) {
                          iVar3 = mbedtls_cipher_reset(&cipher_ctx);
                          if (iVar3 == 0) {
                            mbedtls_md_hmac_starts(&md_ctx,local_a78,0x20);
                            uVar10 = local_b30 & 0xffffffff;
                            for (lVar14 = 0; lVar14 < (long)local_b30; lVar14 = lVar14 + uVar17) {
                              lVar15 = uVar10 - lVar14;
                              if (cipher_ctx.cipher_info == (mbedtls_cipher_info_t *)0x0) {
                                sVar7 = 0;
                                if (lVar15 < 1) goto LAB_00106a3d;
                              }
                              else {
                                sVar7 = (size_t)(cipher_ctx.cipher_info)->block_size;
                                if (lVar15 <= (long)sVar7) {
LAB_00106a3d:
                                  sVar7 = (size_t)(uint)((int)local_b30 - (int)lVar14);
                                }
                              }
                              sVar12 = fread(buffer,1,sVar7,__stream);
                              if (sVar12 != sVar7) {
                                uVar10 = 0;
                                if (cipher_ctx.cipher_info != (mbedtls_cipher_info_t *)0x0) {
                                  uVar10 = (ulong)(cipher_ctx.cipher_info)->block_size;
                                }
                                fprintf(_stderr,"fread(%d bytes) failed\n",uVar10);
                                goto LAB_00107023;
                              }
                              mbedtls_md_hmac_update(&md_ctx,buffer,sVar7);
                              iVar3 = mbedtls_cipher_update(&cipher_ctx,buffer,sVar7,output,&olen);
                              if (iVar3 != 0) {
                                fwrite("mbedtls_cipher_update() returned error\n",0x27,1,_stderr);
                                goto LAB_00107023;
                              }
                              sVar7 = fwrite(output,1,olen,__s);
                              if (sVar7 != olen) {
                                fprintf(_stderr,"fwrite(%ld bytes) failed\n");
                                goto LAB_00107023;
                              }
                              if (cipher_ctx.cipher_info == (mbedtls_cipher_info_t *)0x0) {
                                uVar17 = 0;
                              }
                              else {
                                uVar17 = (ulong)(cipher_ctx.cipher_info)->block_size;
                              }
                            }
                            mbedtls_md_hmac_finish(&md_ctx,local_a78);
                            pmVar5 = local_b28;
                            bVar1 = mbedtls_md_get_size(local_b28);
                            sVar7 = fread(buffer,1,(ulong)bVar1,__stream);
                            bVar1 = mbedtls_md_get_size(pmVar5);
                            pFVar6 = _stderr;
                            if (sVar7 == bVar1) {
                              bVar1 = 0;
                              for (uVar10 = 0; bVar2 = mbedtls_md_get_size(pmVar5), uVar10 < bVar2;
                                  uVar10 = uVar10 + 1) {
                                bVar1 = bVar1 | buffer[uVar10] ^ local_a78[uVar10];
                              }
                              if (bVar1 != 0) {
                                fwrite("HMAC check failed: wrong key, or file corrupted.\n",0x31,1,
                                       _stderr);
                                goto LAB_00106f63;
                              }
                              mbedtls_cipher_finish(&cipher_ctx,output,&olen);
                              sVar7 = fwrite(output,1,olen,__s);
                              if (sVar7 == olen) {
                                local_b5c = 0;
                              }
                              else {
                                fprintf(_stderr,"fwrite(%ld bytes) failed\n");
                              }
                            }
                            else {
                              bVar1 = mbedtls_md_get_size(pmVar5);
                              fprintf(pFVar6,"fread(%d bytes) failed\n",(ulong)bVar1);
                            }
                            goto LAB_00107023;
                          }
                          pcVar16 = "mbedtls_cipher_reset() returned error\n";
                          sStack_b70 = 0x26;
                        }
                        else {
                          pcVar16 = "mbedtls_cipher_set_iv() returned error\n";
                          sStack_b70 = 0x27;
                        }
                        goto LAB_00106e17;
                      }
                      fwrite("mbedtls_cipher_setkey() returned error\n",0x27,1,_stderr);
                      goto LAB_00106dc6;
                    }
                    pcVar16 = "fread(%d bytes) failed\n";
                    goto LAB_00106d80;
                  }
                  bVar1 = mbedtls_md_get_size(pmVar5);
                  if (cipher_ctx.cipher_info == (mbedtls_cipher_info_t *)0x0) {
                    uVar13 = 0;
                  }
                  else {
                    uVar13 = (cipher_ctx.cipher_info)->block_size;
                    if ((long)(uVar10 - bVar1) % (long)(ulong)uVar13 == 0) goto LAB_001068bd;
                  }
                  pcVar16 = "File content not a multiple of the block size (%d).\n";
                  uVar10 = (ulong)uVar13;
                  goto LAB_00107012;
                }
                pcVar16 = "Invalid cipher block size: 0. \n";
                sStack_b70 = 0x1f;
              }
            }
            fwrite(pcVar16,sStack_b70,1,_stderr);
          }
        }
        else {
          pcVar16 = "mbedtls_md_setup failed\n";
          sStack_b70 = 0x18;
LAB_00106e17:
          fwrite(pcVar16,sStack_b70,1,_stderr);
        }
      }
LAB_00107023:
      fclose(__stream);
      if (__s != (FILE *)0x0) {
        fclose(__s);
      }
      goto LAB_0010703d;
    }
    fprintf(_stderr,"fopen(%s,rb) failed\n",argv[2]);
  }
  else {
    pcVar16 = "invalid operation mode\n";
    sStack_b70 = 0x17;
LAB_00106c44:
    fwrite(pcVar16,sStack_b70,1,_stderr);
  }
  local_b5c = 1;
LAB_0010703d:
  uVar17 = 0;
  uVar10 = (ulong)(uint)argc;
  if (argc < 1) {
    uVar10 = uVar17;
  }
  for (; uVar10 != uVar17; uVar17 = uVar17 + 1) {
    pcVar16 = argv[uVar17];
    sVar7 = strlen(pcVar16);
    mbedtls_platform_zeroize(pcVar16,sVar7);
  }
  mbedtls_platform_zeroize(IV,0x10);
  mbedtls_platform_zeroize(key,0x200);
  mbedtls_platform_zeroize(buffer,0x400);
  mbedtls_platform_zeroize(output,0x400);
  mbedtls_platform_zeroize(local_a78,0x40);
  mbedtls_cipher_free(&cipher_ctx);
  mbedtls_md_free(&md_ctx);
  return local_b5c;
}

Assistant:

int main( int argc, char *argv[] )
{
    int ret = 1, i, n;
    int exit_code = MBEDTLS_EXIT_FAILURE;
    int mode;
    size_t keylen, ilen, olen;
    FILE *fkey, *fin = NULL, *fout = NULL;

    char *p;
    unsigned char IV[16];
    unsigned char key[512];
    unsigned char digest[MBEDTLS_MD_MAX_SIZE];
    unsigned char buffer[1024];
    unsigned char output[1024];
    unsigned char diff;

    const mbedtls_cipher_info_t *cipher_info;
    const mbedtls_md_info_t *md_info;
    mbedtls_cipher_context_t cipher_ctx;
    mbedtls_md_context_t md_ctx;
#if defined(_WIN32_WCE)
    long filesize, offset;
#elif defined(_WIN32)
       LARGE_INTEGER li_size;
    __int64 filesize, offset;
#else
      off_t filesize, offset;
#endif

    mbedtls_cipher_init( &cipher_ctx );
    mbedtls_md_init( &md_ctx );

    /*
     * Parse the command-line arguments.
     */
    if( argc != 7 )
    {
        const int *list;

        mbedtls_printf( USAGE );

        mbedtls_printf( "Available ciphers:\n" );
        list = mbedtls_cipher_list();
        while( *list )
        {
            cipher_info = mbedtls_cipher_info_from_type( *list );
            mbedtls_printf( "  %s\n", cipher_info->name );
            list++;
        }

        mbedtls_printf( "\nAvailable message digests:\n" );
        list = mbedtls_md_list();
        while( *list )
        {
            md_info = mbedtls_md_info_from_type( *list );
            mbedtls_printf( "  %s\n", mbedtls_md_get_name( md_info ) );
            list++;
        }

#if defined(_WIN32)
        mbedtls_printf( "\n  Press Enter to exit this program.\n" );
        fflush( stdout ); getchar();
#endif

        goto exit;
    }

    mode = atoi( argv[1] );

    if( mode != MODE_ENCRYPT && mode != MODE_DECRYPT )
    {
        mbedtls_fprintf( stderr, "invalid operation mode\n" );
        goto exit;
    }

    if( strcmp( argv[2], argv[3] ) == 0 )
    {
        mbedtls_fprintf( stderr, "input and output filenames must differ\n" );
        goto exit;
    }

    if( ( fin = fopen( argv[2], "rb" ) ) == NULL )
    {
        mbedtls_fprintf( stderr, "fopen(%s,rb) failed\n", argv[2] );
        goto exit;
    }

    if( ( fout = fopen( argv[3], "wb+" ) ) == NULL )
    {
        mbedtls_fprintf( stderr, "fopen(%s,wb+) failed\n", argv[3] );
        goto exit;
    }

    /*
     * Read the Cipher and MD from the command line
     */
    cipher_info = mbedtls_cipher_info_from_string( argv[4] );
    if( cipher_info == NULL )
    {
        mbedtls_fprintf( stderr, "Cipher '%s' not found\n", argv[4] );
        goto exit;
    }
    if( ( ret = mbedtls_cipher_setup( &cipher_ctx, cipher_info) ) != 0 )
    {
        mbedtls_fprintf( stderr, "mbedtls_cipher_setup failed\n" );
        goto exit;
    }

    md_info = mbedtls_md_info_from_string( argv[5] );
    if( md_info == NULL )
    {
        mbedtls_fprintf( stderr, "Message Digest '%s' not found\n", argv[5] );
        goto exit;
    }

    if( mbedtls_md_setup( &md_ctx, md_info, 1 ) != 0 )
    {
        mbedtls_fprintf( stderr, "mbedtls_md_setup failed\n" );
        goto exit;
    }

    /*
     * Read the secret key from file or command line
     */
    if( ( fkey = fopen( argv[6], "rb" ) ) != NULL )
    {
        keylen = fread( key, 1, sizeof( key ), fkey );
        fclose( fkey );
    }
    else
    {
        if( memcmp( argv[6], "hex:", 4 ) == 0 )
        {
            p = &argv[6][4];
            keylen = 0;

            while( sscanf( p, "%02X", &n ) > 0 &&
                   keylen < (int) sizeof( key ) )
            {
                key[keylen++] = (unsigned char) n;
                p += 2;
            }
        }
        else
        {
            keylen = strlen( argv[6] );

            if( keylen > (int) sizeof( key ) )
                keylen = (int) sizeof( key );

            memcpy( key, argv[6], keylen );
        }
    }

#if defined(_WIN32_WCE)
    filesize = fseek( fin, 0L, SEEK_END );
#else
#if defined(_WIN32)
    /*
     * Support large files (> 2Gb) on Win32
     */
    li_size.QuadPart = 0;
    li_size.LowPart  =
        SetFilePointer( (HANDLE) _get_osfhandle( _fileno( fin ) ),
                        li_size.LowPart, &li_size.HighPart, FILE_END );

    if( li_size.LowPart == 0xFFFFFFFF && GetLastError() != NO_ERROR )
    {
        mbedtls_fprintf( stderr, "SetFilePointer(0,FILE_END) failed\n" );
        goto exit;
    }

    filesize = li_size.QuadPart;
#else
    if( ( filesize = lseek( fileno( fin ), 0, SEEK_END ) ) < 0 )
    {
        perror( "lseek" );
        goto exit;
    }
#endif
#endif

    if( fseek( fin, 0, SEEK_SET ) < 0 )
    {
        mbedtls_fprintf( stderr, "fseek(0,SEEK_SET) failed\n" );
        goto exit;
    }

    if( mode == MODE_ENCRYPT )
    {
        /*
         * Generate the initialization vector as:
         * IV = MD( filesize || filename )[0..15]
         */
        for( i = 0; i < 8; i++ )
            buffer[i] = (unsigned char)( filesize >> ( i << 3 ) );

        p = argv[2];

        mbedtls_md_starts( &md_ctx );
        mbedtls_md_update( &md_ctx, buffer, 8 );
        mbedtls_md_update( &md_ctx, (unsigned char *) p, strlen( p ) );
        mbedtls_md_finish( &md_ctx, digest );

        memcpy( IV, digest, 16 );

        /*
         * Append the IV at the beginning of the output.
         */
        if( fwrite( IV, 1, 16, fout ) != 16 )
        {
            mbedtls_fprintf( stderr, "fwrite(%d bytes) failed\n", 16 );
            goto exit;
        }

        /*
         * Hash the IV and the secret key together 8192 times
         * using the result to setup the AES context and HMAC.
         */
        memset( digest, 0,  32 );
        memcpy( digest, IV, 16 );

        for( i = 0; i < 8192; i++ )
        {
            mbedtls_md_starts( &md_ctx );
            mbedtls_md_update( &md_ctx, digest, 32 );
            mbedtls_md_update( &md_ctx, key, keylen );
            mbedtls_md_finish( &md_ctx, digest );

        }

        if( mbedtls_cipher_setkey( &cipher_ctx, digest, cipher_info->key_bitlen,
                           MBEDTLS_ENCRYPT ) != 0 )
        {
            mbedtls_fprintf( stderr, "mbedtls_cipher_setkey() returned error\n");
            goto exit;
        }
        if( mbedtls_cipher_set_iv( &cipher_ctx, IV, 16 ) != 0 )
        {
            mbedtls_fprintf( stderr, "mbedtls_cipher_set_iv() returned error\n");
            goto exit;
        }
        if( mbedtls_cipher_reset( &cipher_ctx ) != 0 )
        {
            mbedtls_fprintf( stderr, "mbedtls_cipher_reset() returned error\n");
            goto exit;
        }

        mbedtls_md_hmac_starts( &md_ctx, digest, 32 );

        /*
         * Encrypt and write the ciphertext.
         */
        for( offset = 0; offset < filesize; offset += mbedtls_cipher_get_block_size( &cipher_ctx ) )
        {
            ilen = ( (unsigned int) filesize - offset > mbedtls_cipher_get_block_size( &cipher_ctx ) ) ?
                mbedtls_cipher_get_block_size( &cipher_ctx ) : (unsigned int) ( filesize - offset );

            if( fread( buffer, 1, ilen, fin ) != ilen )
            {
                mbedtls_fprintf( stderr, "fread(%ld bytes) failed\n", (long) ilen );
                goto exit;
            }

            if( mbedtls_cipher_update( &cipher_ctx, buffer, ilen, output, &olen ) != 0 )
            {
                mbedtls_fprintf( stderr, "mbedtls_cipher_update() returned error\n");
                goto exit;
            }

            mbedtls_md_hmac_update( &md_ctx, output, olen );

            if( fwrite( output, 1, olen, fout ) != olen )
            {
                mbedtls_fprintf( stderr, "fwrite(%ld bytes) failed\n", (long) olen );
                goto exit;
            }
        }

        if( mbedtls_cipher_finish( &cipher_ctx, output, &olen ) != 0 )
        {
            mbedtls_fprintf( stderr, "mbedtls_cipher_finish() returned error\n" );
            goto exit;
        }
        mbedtls_md_hmac_update( &md_ctx, output, olen );

        if( fwrite( output, 1, olen, fout ) != olen )
        {
            mbedtls_fprintf( stderr, "fwrite(%ld bytes) failed\n", (long) olen );
            goto exit;
        }

        /*
         * Finally write the HMAC.
         */
        mbedtls_md_hmac_finish( &md_ctx, digest );

        if( fwrite( digest, 1, mbedtls_md_get_size( md_info ), fout ) != mbedtls_md_get_size( md_info ) )
        {
            mbedtls_fprintf( stderr, "fwrite(%d bytes) failed\n", mbedtls_md_get_size( md_info ) );
            goto exit;
        }
    }

    if( mode == MODE_DECRYPT )
    {
        /*
         *  The encrypted file must be structured as follows:
         *
         *        00 .. 15              Initialization Vector
         *        16 .. 31              Encrypted Block #1
         *           ..
         *      N*16 .. (N+1)*16 - 1    Encrypted Block #N
         *  (N+1)*16 .. (N+1)*16 + n    Hash(ciphertext)
         */
        if( filesize < 16 + mbedtls_md_get_size( md_info ) )
        {
            mbedtls_fprintf( stderr, "File too short to be encrypted.\n" );
            goto exit;
        }

        if( mbedtls_cipher_get_block_size( &cipher_ctx ) == 0 )
        {
            mbedtls_fprintf( stderr, "Invalid cipher block size: 0. \n" );
            goto exit;
        }

        /*
         * Check the file size.
         */
        if( cipher_info->mode != MBEDTLS_MODE_GCM &&
            ( ( filesize - mbedtls_md_get_size( md_info ) ) %
                mbedtls_cipher_get_block_size( &cipher_ctx ) ) != 0 )
        {
            mbedtls_fprintf( stderr, "File content not a multiple of the block size (%d).\n",
                     mbedtls_cipher_get_block_size( &cipher_ctx ));
            goto exit;
        }

        /*
         * Subtract the IV + HMAC length.
         */
        filesize -= ( 16 + mbedtls_md_get_size( md_info ) );

        /*
         * Read the IV and original filesize modulo 16.
         */
        if( fread( buffer, 1, 16, fin ) != 16 )
        {
            mbedtls_fprintf( stderr, "fread(%d bytes) failed\n", 16 );
            goto exit;
        }

        memcpy( IV, buffer, 16 );

        /*
         * Hash the IV and the secret key together 8192 times
         * using the result to setup the AES context and HMAC.
         */
        memset( digest, 0,  32 );
        memcpy( digest, IV, 16 );

        for( i = 0; i < 8192; i++ )
        {
            mbedtls_md_starts( &md_ctx );
            mbedtls_md_update( &md_ctx, digest, 32 );
            mbedtls_md_update( &md_ctx, key, keylen );
            mbedtls_md_finish( &md_ctx, digest );
        }

        if( mbedtls_cipher_setkey( &cipher_ctx, digest, cipher_info->key_bitlen,
                           MBEDTLS_DECRYPT ) != 0 )
        {
            mbedtls_fprintf( stderr, "mbedtls_cipher_setkey() returned error\n" );
            goto exit;
        }

        if( mbedtls_cipher_set_iv( &cipher_ctx, IV, 16 ) != 0 )
        {
            mbedtls_fprintf( stderr, "mbedtls_cipher_set_iv() returned error\n" );
            goto exit;
        }

        if( mbedtls_cipher_reset( &cipher_ctx ) != 0 )
        {
            mbedtls_fprintf( stderr, "mbedtls_cipher_reset() returned error\n" );
            goto exit;
        }

        mbedtls_md_hmac_starts( &md_ctx, digest, 32 );

        /*
         * Decrypt and write the plaintext.
         */
        for( offset = 0; offset < filesize; offset += mbedtls_cipher_get_block_size( &cipher_ctx ) )
        {
            ilen = ( (unsigned int) filesize - offset > mbedtls_cipher_get_block_size( &cipher_ctx ) ) ?
                mbedtls_cipher_get_block_size( &cipher_ctx ) : (unsigned int) ( filesize - offset );

            if( fread( buffer, 1, ilen, fin ) != ilen )
            {
                mbedtls_fprintf( stderr, "fread(%d bytes) failed\n",
                    mbedtls_cipher_get_block_size( &cipher_ctx ) );
                goto exit;
            }

            mbedtls_md_hmac_update( &md_ctx, buffer, ilen );
            if( mbedtls_cipher_update( &cipher_ctx, buffer, ilen, output,
                                       &olen ) != 0 )
            {
                mbedtls_fprintf( stderr, "mbedtls_cipher_update() returned error\n" );
                goto exit;
            }

            if( fwrite( output, 1, olen, fout ) != olen )
            {
                mbedtls_fprintf( stderr, "fwrite(%ld bytes) failed\n", (long) olen );
                goto exit;
            }
        }

        /*
         * Verify the message authentication code.
         */
        mbedtls_md_hmac_finish( &md_ctx, digest );

        if( fread( buffer, 1, mbedtls_md_get_size( md_info ), fin ) != mbedtls_md_get_size( md_info ) )
        {
            mbedtls_fprintf( stderr, "fread(%d bytes) failed\n", mbedtls_md_get_size( md_info ) );
            goto exit;
        }

        /* Use constant-time buffer comparison */
        diff = 0;
        for( i = 0; i < mbedtls_md_get_size( md_info ); i++ )
            diff |= digest[i] ^ buffer[i];

        if( diff != 0 )
        {
            mbedtls_fprintf( stderr, "HMAC check failed: wrong key, "
                             "or file corrupted.\n" );
            goto exit;
        }

        /*
         * Write the final block of data
         */
        mbedtls_cipher_finish( &cipher_ctx, output, &olen );

        if( fwrite( output, 1, olen, fout ) != olen )
        {
            mbedtls_fprintf( stderr, "fwrite(%ld bytes) failed\n", (long) olen );
            goto exit;
        }
    }

    exit_code = MBEDTLS_EXIT_SUCCESS;

exit:
    if( fin )
        fclose( fin );
    if( fout )
        fclose( fout );

    /* Zeroize all command line arguments to also cover
       the case when the user has missed or reordered some,
       in which case the key might not be in argv[6]. */
    for( i = 0; i < argc; i++ )
        mbedtls_platform_zeroize( argv[i], strlen( argv[i] ) );

    mbedtls_platform_zeroize( IV,     sizeof( IV ) );
    mbedtls_platform_zeroize( key,    sizeof( key ) );
    mbedtls_platform_zeroize( buffer, sizeof( buffer ) );
    mbedtls_platform_zeroize( output, sizeof( output ) );
    mbedtls_platform_zeroize( digest, sizeof( digest ) );

    mbedtls_cipher_free( &cipher_ctx );
    mbedtls_md_free( &md_ctx );

    return( exit_code );
}